

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_lda_inc.c
# Opt level: O2

void work_lda_vxc_pol(xc_func_type *p,size_t np,double *rho,xc_lda_out_params *out)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double __x;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double __x_00;
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double __x_01;
  double dVar41;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double dVar93;
  double dVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double local_520;
  double local_4f0;
  double local_4b8;
  double local_428;
  double local_398;
  double local_320;
  
  local_320 = 0.0;
  for (sVar4 = 0; np != sVar4; sVar4 = sVar4 + 1) {
    lVar3 = (long)(p->dim).rho * sVar4;
    dVar39 = rho[lVar3];
    if (p->nspin == 2) {
      dVar39 = dVar39 + rho[lVar3 + 1];
    }
    dVar122 = p->dens_threshold;
    if (dVar122 <= dVar39) {
      if ((p->nspin == 2) && (local_320 = rho[lVar3 + 1], rho[lVar3 + 1] <= dVar122)) {
        local_320 = dVar122;
      }
      dVar39 = rho[lVar3];
      if (rho[lVar3] <= dVar122) {
        dVar39 = dVar122;
      }
      dVar9 = cbrt(0.3183098861837907);
      dVar10 = dVar9 * 1.4422495703074083;
      dVar11 = dVar10 * 2.519842099789747;
      dVar40 = dVar39 - local_320;
      dVar39 = dVar39 + local_320;
      dVar60 = 1.0 / dVar39;
      __x_01 = dVar40 * dVar60 + 1.0;
      dVar122 = p->zeta_threshold;
      dVar12 = cbrt(dVar122);
      dVar13 = cbrt(__x_01);
      local_428 = dVar122 * dVar12;
      dVar14 = local_428;
      if (dVar122 < __x_01) {
        dVar14 = dVar13 * __x_01;
      }
      dVar15 = dVar14 * 1.5874010519681996;
      dVar16 = cbrt(dVar39);
      dVar17 = cbrt(9.0);
      dVar41 = dVar17 * dVar17 * dVar9 * dVar9 * p->cam_omega;
      dVar61 = 1.0 / dVar16;
      dVar62 = dVar61 * 1.4422495703074083;
      uVar5 = -(ulong)(__x_01 <= dVar122);
      dVar89 = (double)(uVar5 & (ulong)dVar12 | ~uVar5 & (ulong)dVar13);
      dVar63 = (dVar62 * (1.0 / dVar89) * dVar41) / 18.0;
      dVar17 = 1.92;
      if (dVar63 <= 1.92) {
        dVar17 = dVar63;
      }
      dVar18 = atan2(1.0,dVar17);
      dVar64 = dVar17 * dVar17;
      dVar19 = 1.0 / dVar64;
      dVar20 = log(dVar19 + 1.0);
      dVar112 = dVar63;
      if (dVar63 <= 1.92) {
        dVar112 = 1.92;
      }
      dVar113 = dVar112 * dVar112;
      dVar123 = dVar113 * dVar113;
      dVar118 = dVar123 * dVar123;
      dVar65 = dVar118 * dVar118;
      dVar110 = 1.0 / dVar65;
      dVar103 = 1.0 / (dVar65 * dVar65);
      dVar65 = 1.0 - dVar20 * (dVar64 + 3.0);
      dVar18 = dVar17 * dVar65 * 0.25 + dVar18;
      if (dVar63 < 1.92) {
        local_4f0 = dVar18 * -2.6666666666666665 * dVar17 + 1.0;
      }
      else {
        auVar59._0_8_ = dVar113 * dVar123;
        auVar91._0_8_ = dVar113 * dVar118;
        auVar91._8_8_ = dVar118 * dVar123;
        auVar57._8_8_ = dVar110;
        auVar57._0_8_ = dVar110;
        auVar96._8_8_ = dVar110;
        auVar96._0_8_ = dVar110;
        auVar98._8_8_ = dVar110;
        auVar98._0_8_ = dVar110;
        auVar56 = divpd(auVar57,auVar91);
        auVar79._0_8_ = 1.0 / (dVar118 * auVar59._0_8_);
        auVar79._8_8_ = dVar110;
        auVar79 = divpd(auVar79,_DAT_00f643f0);
        auVar100._8_8_ = dVar123;
        auVar100._0_8_ = dVar113;
        auVar95 = divpd(auVar96,auVar100);
        auVar96 = divpd(auVar95,_DAT_00f64400);
        auVar59._8_8_ = dVar118;
        auVar95 = divpd(auVar98,auVar59);
        auVar98 = divpd(auVar95,_DAT_00f64410);
        auVar57 = divpd(auVar56,_DAT_00f64420);
        auVar56._0_8_ = dVar110 / (dVar118 * auVar59._0_8_);
        auVar56._8_8_ = dVar103;
        auVar56 = divpd(auVar56,_DAT_00f64430);
        auVar95._8_8_ = dVar103;
        auVar95._0_8_ = dVar103;
        auVar95 = divpd(auVar95,auVar100);
        auVar95 = divpd(auVar95,_DAT_00f64440);
        local_4f0 = ((((((((((((1.0 / auVar91._8_8_) / -364.0 +
                               (1.0 / auVar91._0_8_) / 231.0 +
                               (1.0 / dVar118) / -135.0 +
                               (1.0 / auVar59._0_8_) / 70.0 +
                               (1.0 / dVar123) / -30.0 + (1.0 / dVar113) / 9.0 + auVar79._0_8_) -
                             auVar79._8_8_) + auVar96._0_8_) - auVar96._8_8_) + auVar98._0_8_) -
                         auVar98._8_8_) + auVar57._0_8_) - auVar57._8_8_) + auVar56._0_8_) -
                     auVar56._8_8_) + auVar95._0_8_) - auVar95._8_8_;
      }
      __x = 1.0 - dVar40 * dVar60;
      dVar1 = p->zeta_threshold;
      dVar21 = cbrt(__x);
      if (dVar1 < __x) {
        local_428 = __x * dVar21;
      }
      dVar42 = local_428 * 1.5874010519681996;
      uVar6 = -(ulong)(__x <= dVar1);
      dVar126 = (double)((ulong)dVar12 & uVar6 | ~uVar6 & (ulong)dVar21);
      dVar66 = (dVar62 * (1.0 / dVar126) * dVar41) / 18.0;
      dVar12 = 1.92;
      if (dVar66 <= 1.92) {
        dVar12 = dVar66;
      }
      dVar22 = atan2(1.0,dVar12);
      dVar43 = dVar12 * dVar12;
      dVar23 = 1.0 / dVar43;
      dVar24 = log(dVar23 + 1.0);
      dVar114 = dVar66;
      if (dVar66 <= 1.92) {
        dVar114 = 1.92;
      }
      dVar115 = dVar114 * dVar114;
      dVar124 = dVar115 * dVar115;
      dVar119 = dVar124 * dVar124;
      dVar44 = dVar119 * dVar119;
      dVar111 = 1.0 / dVar44;
      dVar104 = 1.0 / (dVar44 * dVar44);
      dVar44 = 1.0 - dVar24 * (dVar43 + 3.0);
      dVar22 = dVar12 * dVar44 * 0.25 + dVar22;
      if (dVar66 < 1.92) {
        dVar107 = dVar22 * -2.6666666666666665 * dVar12 + 1.0;
      }
      else {
        auVar36._0_8_ = dVar115 * dVar124;
        auVar92._0_8_ = dVar115 * dVar119;
        auVar92._8_8_ = dVar119 * dVar124;
        auVar58._8_8_ = dVar111;
        auVar58._0_8_ = dVar111;
        auVar97._8_8_ = dVar111;
        auVar97._0_8_ = dVar111;
        auVar99._8_8_ = dVar111;
        auVar99._0_8_ = dVar111;
        auVar59 = divpd(auVar58,auVar92);
        auVar80._0_8_ = 1.0 / (dVar119 * auVar36._0_8_);
        auVar80._8_8_ = dVar111;
        auVar57 = divpd(auVar80,_DAT_00f643f0);
        auVar81._8_8_ = dVar124;
        auVar81._0_8_ = dVar115;
        auVar56 = divpd(auVar97,auVar81);
        auVar79 = divpd(auVar56,_DAT_00f64400);
        auVar36._8_8_ = dVar119;
        auVar56 = divpd(auVar99,auVar36);
        auVar100 = divpd(auVar56,_DAT_00f64410);
        auVar95 = divpd(auVar59,_DAT_00f64420);
        auVar37._0_8_ = dVar111 / (dVar119 * auVar36._0_8_);
        auVar37._8_8_ = dVar104;
        auVar59 = divpd(auVar37,_DAT_00f64430);
        auVar38._8_8_ = dVar104;
        auVar38._0_8_ = dVar104;
        auVar56 = divpd(auVar38,auVar81);
        auVar56 = divpd(auVar56,_DAT_00f64440);
        dVar107 = ((((((((((((1.0 / auVar92._8_8_) / -364.0 +
                             (1.0 / auVar92._0_8_) / 231.0 +
                             (1.0 / dVar119) / -135.0 +
                             (1.0 / auVar36._0_8_) / 70.0 +
                             (1.0 / dVar124) / -30.0 + (1.0 / dVar115) / 9.0 + auVar57._0_8_) -
                           auVar57._8_8_) + auVar79._0_8_) - auVar79._8_8_) + auVar100._0_8_) -
                       auVar100._8_8_) + auVar95._0_8_) - auVar95._8_8_) + auVar59._0_8_) -
                   auVar59._8_8_) + auVar56._0_8_) - auVar56._8_8_;
      }
      dVar25 = dVar16 * dVar107;
      dVar45 = dVar61 * 2.519842099789747 * dVar10;
      dVar26 = dVar45 * 0.053425 + 1.0;
      dVar82 = SQRT(dVar45);
      local_520 = dVar82;
      if (dVar45 < 0.0) {
        local_520 = sqrt(dVar45);
      }
      dVar27 = dVar16 * local_4f0;
      if (dVar45 < 0.0) {
        dVar82 = sqrt(dVar45);
      }
      dVar82 = dVar82 * dVar45;
      dVar46 = dVar9 * dVar9 * 2.080083823051904;
      dVar67 = 1.0 / (dVar16 * dVar16);
      dVar68 = dVar67 * 1.5874010519681996 * dVar46;
      dVar47 = dVar68 * 0.123235 + dVar82 * 0.204775 + local_520 * 3.79785 + dVar45 * 0.8969;
      dVar28 = 16.081979498692537 / dVar47 + 1.0;
      dVar29 = log(dVar28);
      dVar30 = dVar29 * 0.0621814 * dVar26;
      dVar48 = dVar40 * dVar40;
      dVar69 = dVar39 * dVar39;
      dVar31 = 1.0 / (dVar69 * dVar69);
      dVar49 = dVar48 * dVar48 * dVar31;
      dVar14 = (dVar14 + local_428 + -2.0) * 1.9236610509315362;
      dVar32 = dVar45 * 0.05137 + 1.0;
      dVar50 = dVar68 * 0.1562925 + dVar82 * 0.420775 + local_520 * 7.05945 + dVar45 * 1.549425;
      __x_00 = 32.16395899738507 / dVar50 + 1.0;
      dVar33 = log(__x_00);
      dVar51 = dVar45 * 0.0278125 + 1.0;
      dVar52 = dVar68 * 0.1241775 + dVar82 * 0.1100325 + local_520 * 5.1785 + dVar45 * 0.905775;
      dVar82 = 29.608749977793437 / dVar52 + 1.0;
      dVar34 = log(dVar82);
      dVar70 = dVar51 * dVar34 * -0.0197516734986138 + dVar33 * -0.0310907 * dVar32 + dVar30;
      dVar53 = dVar51 * dVar34 * 0.0197516734986138;
      dVar71 = dVar53 * dVar14 + (dVar14 * dVar70 * dVar49 - dVar30);
      dVar68 = dVar68 * 0.25 + dVar45 * -0.225 + 3.2;
      dVar30 = 1.0 / dVar68;
      dVar54 = (dVar27 * -0.09375 * dVar15 * dVar11 - dVar25 * 0.09375 * dVar42 * dVar11) +
               dVar30 * 3.4602 * dVar71;
      pdVar2 = out->zk;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar3 = (long)(p->dim).zk * sVar4;
        pdVar2[lVar3] = pdVar2[lVar3] + dVar54;
      }
      dVar35 = (1.0 / dVar69) * dVar40;
      dVar93 = dVar60 - dVar35;
      dVar55 = 0.0;
      if (dVar122 < __x_01) {
        dVar55 = dVar93 * 1.3333333333333333 * dVar13;
      }
      dVar113 = dVar113 * dVar112;
      dVar116 = 1.0 / (dVar89 * dVar89);
      dVar83 = 1.0 / (dVar13 * dVar13);
      dVar72 = dVar112 * dVar123;
      dVar123 = dVar123 * dVar113;
      dVar94 = 1.0 / (dVar112 * dVar118);
      dVar120 = dVar110 / (dVar112 * dVar118);
      dVar84 = 1.0 / (dVar113 * dVar118);
      dVar85 = dVar110 / (dVar113 * dVar118);
      dVar86 = 1.0 / (dVar118 * dVar72);
      dVar87 = dVar110 / (dVar118 * dVar72);
      dVar88 = 1.0 / (dVar118 * dVar123);
      dVar105 = dVar110 / (dVar118 * dVar123);
      dVar101 = 1.0 / (dVar19 + 1.0);
      dVar127 = (dVar64 + 3.0) * (1.0 / (dVar64 * dVar17));
      dVar118 = local_4f0 * dVar67 * dVar15 * dVar11 * 0.03125;
      dVar61 = dVar61 / dVar39;
      dVar89 = ((1.0 / dVar89) * dVar61 * 1.4422495703074083 * dVar41) / -54.0;
      dVar64 = ((double)(~uVar5 & (ulong)((dVar93 * dVar83) / 3.0)) * dVar116 * dVar62 * dVar41) /
               -18.0 + dVar89;
      uVar7 = -(ulong)(1.92 < dVar63);
      if (dVar63 < 1.92) {
        dVar64 = (double)(~uVar7 & (ulong)dVar64);
        local_398 = dVar18 * -2.6666666666666665 * dVar64 +
                    ((dVar20 * -2.0 * dVar64 * dVar17 +
                     (dVar64 * dVar101 + dVar64 * dVar101) * dVar127) * dVar17 * 0.25 +
                    dVar19 * -dVar101 * dVar64 + dVar64 * dVar65 * 0.25) * -2.6666666666666665 *
                    dVar17;
      }
      else {
        dVar64 = (double)((ulong)dVar64 & uVar7);
        local_398 = dVar64 * 0.005120910384068279 * (dVar103 / dVar72) +
                    dVar64 * -0.0056808688387635755 * (dVar103 / dVar113) +
                    dVar64 * 0.006337888690829867 * (dVar103 / dVar112) +
                    dVar64 * -0.007115749525616698 * dVar105 +
                    dVar64 * 0.008045977011494253 * dVar87 +
                    dVar64 * -0.009171075837742505 * dVar85 +
                    dVar64 * 0.01054945054945055 * dVar120 +
                    dVar64 * -0.012263099219620958 * (dVar110 / dVar123) +
                    dVar64 * 0.01443001443001443 * (dVar110 / dVar72) +
                    dVar64 * -0.01722488038277512 * (dVar110 / dVar113) +
                    dVar64 * 0.02091503267973856 * (dVar110 / dVar112) +
                    dVar64 * -0.025925925925925925 * dVar88 +
                    dVar64 * 0.03296703296703297 * dVar86 +
                    dVar64 * -0.04329004329004329 * dVar84 +
                    dVar64 * 0.05925925925925926 * dVar94 +
                    dVar64 * -0.08571428571428572 * (1.0 / dVar123) +
                    dVar64 * -0.2222222222222222 * (1.0 / dVar113) +
                    dVar64 * 0.13333333333333333 * (1.0 / dVar72);
      }
      dVar73 = 1.0 / (dVar21 * dVar21);
      dVar64 = 0.0;
      if (dVar1 < __x) {
        dVar64 = (dVar73 * dVar93) / -3.0;
      }
      dVar102 = (double)(~uVar6 & (ulong)(dVar93 * -1.3333333333333333 * dVar21));
      dVar115 = dVar115 * dVar114;
      dVar106 = 1.0 / (dVar126 * dVar126);
      dVar93 = dVar114 * dVar124;
      dVar124 = dVar124 * dVar115;
      dVar90 = 1.0 / (dVar114 * dVar119);
      dVar108 = 1.0 / (dVar115 * dVar119);
      dVar109 = dVar111 / (dVar114 * dVar119);
      dVar74 = dVar111 / (dVar115 * dVar119);
      dVar75 = 1.0 / (dVar119 * dVar93);
      dVar76 = dVar111 / (dVar119 * dVar93);
      dVar77 = 1.0 / (dVar119 * dVar124);
      dVar125 = dVar111 / (dVar119 * dVar124);
      dVar117 = 1.0 / (dVar23 + 1.0);
      dVar119 = (dVar43 + 3.0) * (1.0 / (dVar43 * dVar12));
      dVar43 = dVar107 * dVar67 * dVar42 * dVar11 * 0.03125;
      dVar126 = (dVar61 * 1.4422495703074083 * (1.0 / dVar126) * dVar41) / -54.0;
      dVar64 = (dVar64 * dVar106 * dVar62 * dVar41) / -18.0 + dVar126;
      uVar8 = -(ulong)(1.92 < dVar66);
      if (dVar66 < 1.92) {
        dVar64 = (double)(~uVar8 & (ulong)dVar64);
        dVar64 = ((dVar24 * -2.0 * dVar64 * dVar12 + (dVar117 * dVar64 + dVar117 * dVar64) * dVar119
                  ) * dVar12 * 0.25 + dVar23 * -dVar117 * dVar64 + dVar44 * dVar64 * 0.25) *
                 -2.6666666666666665 * dVar12 + dVar22 * -2.6666666666666665 * dVar64;
      }
      else {
        dVar64 = (double)((ulong)dVar64 & uVar8);
        dVar64 = dVar64 * 0.005120910384068279 * (dVar104 / dVar93) +
                 dVar64 * -0.0056808688387635755 * (dVar104 / dVar115) +
                 dVar64 * 0.006337888690829867 * (dVar104 / dVar114) +
                 dVar64 * -0.007115749525616698 * dVar125 +
                 dVar64 * 0.008045977011494253 * dVar76 +
                 dVar64 * -0.009171075837742505 * dVar74 +
                 dVar64 * 0.01054945054945055 * dVar109 +
                 dVar64 * -0.012263099219620958 * (dVar111 / dVar124) +
                 dVar64 * 0.01443001443001443 * (dVar111 / dVar93) +
                 dVar64 * -0.01722488038277512 * (dVar111 / dVar115) +
                 dVar64 * 0.02091503267973856 * (dVar111 / dVar114) +
                 dVar64 * -0.025925925925925925 * dVar77 +
                 dVar64 * 0.03296703296703297 * dVar75 +
                 dVar64 * -0.04329004329004329 * dVar108 +
                 dVar64 * 0.05925925925925926 * dVar90 +
                 dVar64 * -0.08571428571428572 * (1.0 / dVar124) +
                 dVar64 * -0.2222222222222222 * (1.0 / dVar115) +
                 dVar64 * 0.13333333333333333 * (1.0 / dVar93);
      }
      dVar121 = dVar61 * 2.519842099789747;
      dVar107 = dVar29 * 0.0011073470983333333 * dVar121 * dVar10;
      dVar29 = dVar9 * 2.519842099789747 * dVar61;
      dVar128 = (1.4422495703074083 / local_520) * dVar29;
      dVar78 = dVar10 * dVar121;
      if (dVar45 < 0.0) {
        dVar45 = sqrt(dVar45);
      }
      else {
        dVar45 = SQRT(dVar45);
      }
      dVar29 = dVar29 * dVar45 * 1.4422495703074083;
      dVar46 = dVar46 * (dVar67 / dVar39) * 1.5874010519681996;
      dVar47 = dVar26 * (1.0 / (dVar47 * dVar47)) *
               (1.0 / dVar28) *
               (dVar46 * -0.08215666666666667 +
               dVar29 * -0.1023875 + dVar128 * -0.632975 + dVar78 * -0.29896666666666666);
      dVar26 = dVar14 * dVar70 * 4.0;
      dVar40 = dVar40 * dVar48 * dVar31 * dVar26;
      dVar26 = dVar48 * dVar48 * (1.0 / (dVar69 * dVar69 * dVar39)) * dVar26;
      dVar45 = 1.0 / (dVar52 * dVar52);
      dVar82 = (1.0 / dVar82) *
               (dVar46 * -0.082785 +
               dVar29 * -0.05501625 + dVar128 * -0.8630833333333333 + dVar78 * -0.301925);
      dVar31 = dVar9 * 2.519842099789747 * dVar61 * dVar34 * 0.00018311447306006544 *
               dVar14 * 1.4422495703074083;
      dVar28 = dVar45 * dVar82 * 0.5848223622634646 * dVar51 * dVar14;
      dVar9 = dVar47 + dVar107;
      dVar61 = (dVar55 + dVar102) * 1.9236610509315362;
      dVar10 = (dVar82 * 0.5848223622634646 * dVar51 * dVar45 +
               dVar34 * 0.00018311447306006544 * dVar121 * dVar10 +
               (((dVar33 * 0.0005323764196666666 * dVar121 * dVar10 +
                 (1.0 / __x_00) *
                 (dVar46 * -0.104195 +
                 dVar29 * -0.2103875 + dVar128 * -1.176575 + dVar78 * -0.516475) *
                 dVar32 * (1.0 / (dVar50 * dVar50))) - dVar107) - dVar47)) * dVar14 * dVar49;
      dVar14 = (dVar78 * 0.075 + dVar46 / -6.0) * (1.0 / (dVar68 * dVar68)) * dVar71 * 3.4602;
      pdVar2 = out->vrho;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar3 = (long)(p->dim).vrho * sVar4;
        pdVar2[lVar3] =
             (((((((dVar55 * 1.5874010519681996 * dVar27 * dVar11 * -0.09375 - dVar118) -
                  local_398 * dVar16 * dVar15 * dVar11 * 0.09375) -
                 dVar102 * 1.5874010519681996 * dVar25 * dVar11 * 0.09375) - dVar43) -
               dVar64 * dVar16 * dVar42 * dVar11 * 0.09375) +
              (((dVar61 * dVar70 * dVar49 + ((dVar40 + dVar9) - dVar26) + dVar10 + dVar53 * dVar61)
               - dVar31) - dVar28) * dVar30 * 3.4602) - dVar14) * dVar39 + dVar54 + pdVar2[lVar3];
      }
      dVar35 = -dVar60 - dVar35;
      dVar60 = 0.0;
      if (dVar122 < __x_01) {
        dVar60 = dVar13 * dVar35 * 1.3333333333333333;
      }
      dVar89 = dVar89 + (dVar116 * (double)(~uVar5 & (ulong)((dVar83 * dVar35) / 3.0)) * dVar62 *
                        dVar41) / -18.0;
      if (dVar63 < 1.92) {
        dVar89 = (double)(~uVar7 & (ulong)dVar89);
        local_4b8 = dVar18 * -2.6666666666666665 * dVar89 +
                    ((dVar20 * -2.0 * dVar89 * dVar17 +
                     dVar127 * (dVar101 * dVar89 + dVar101 * dVar89)) * dVar17 * 0.25 +
                    -dVar101 * dVar19 * dVar89 + dVar65 * dVar89 * 0.25) * -2.6666666666666665 *
                    dVar17;
      }
      else {
        dVar89 = (double)(uVar7 & (ulong)dVar89);
        local_4b8 = (dVar103 / dVar72) * dVar89 * 0.005120910384068279 +
                    (dVar103 / dVar113) * dVar89 * -0.0056808688387635755 +
                    (dVar103 / dVar112) * dVar89 * 0.006337888690829867 +
                    dVar105 * dVar89 * -0.007115749525616698 +
                    dVar87 * dVar89 * 0.008045977011494253 +
                    dVar85 * dVar89 * -0.009171075837742505 +
                    dVar120 * dVar89 * 0.01054945054945055 +
                    (dVar110 / dVar123) * dVar89 * -0.012263099219620958 +
                    (dVar110 / dVar72) * dVar89 * 0.01443001443001443 +
                    (dVar110 / dVar113) * dVar89 * -0.01722488038277512 +
                    (dVar110 / dVar112) * dVar89 * 0.02091503267973856 +
                    dVar88 * dVar89 * -0.025925925925925925 +
                    dVar86 * dVar89 * 0.03296703296703297 +
                    dVar84 * dVar89 * -0.04329004329004329 +
                    dVar94 * dVar89 * 0.05925925925925926 +
                    (1.0 / dVar123) * dVar89 * -0.08571428571428572 +
                    dVar89 * -0.2222222222222222 * (1.0 / dVar113) +
                    dVar89 * (1.0 / dVar72) * 0.13333333333333333;
      }
      dVar122 = 0.0;
      if (dVar1 < __x) {
        dVar122 = (dVar73 * dVar35) / -3.0;
      }
      dVar13 = (double)(~uVar6 & (ulong)(dVar35 * -1.3333333333333333 * dVar21));
      dVar126 = dVar126 + (dVar41 * dVar62 * dVar106 * dVar122) / -18.0;
      if (dVar66 < 1.92) {
        dVar126 = (double)(~uVar8 & (ulong)dVar126);
        dVar122 = ((dVar24 * -2.0 * dVar126 * dVar12 +
                   dVar119 * (dVar117 * dVar126 + dVar117 * dVar126)) * dVar12 * 0.25 +
                  -dVar117 * dVar23 * dVar126 + dVar44 * dVar126 * 0.25) * -2.6666666666666665 *
                  dVar12 + dVar22 * -2.6666666666666665 * dVar126;
      }
      else {
        dVar126 = (double)(uVar8 & (ulong)dVar126);
        dVar122 = (dVar104 / dVar93) * dVar126 * 0.005120910384068279 +
                  (dVar104 / dVar115) * dVar126 * -0.0056808688387635755 +
                  (dVar104 / dVar114) * dVar126 * 0.006337888690829867 +
                  dVar125 * dVar126 * -0.007115749525616698 +
                  dVar76 * dVar126 * 0.008045977011494253 +
                  dVar74 * dVar126 * -0.009171075837742505 +
                  dVar109 * dVar126 * 0.01054945054945055 +
                  (dVar111 / dVar124) * dVar126 * -0.012263099219620958 +
                  (dVar111 / dVar93) * dVar126 * 0.01443001443001443 +
                  (dVar111 / dVar115) * dVar126 * -0.01722488038277512 +
                  (dVar111 / dVar114) * dVar126 * 0.02091503267973856 +
                  dVar77 * dVar126 * -0.025925925925925925 +
                  dVar75 * dVar126 * 0.03296703296703297 +
                  dVar108 * dVar126 * -0.04329004329004329 +
                  dVar90 * dVar126 * 0.05925925925925926 +
                  (1.0 / dVar124) * dVar126 * -0.08571428571428572 +
                  dVar126 * -0.2222222222222222 * (1.0 / dVar115) +
                  dVar126 * (1.0 / dVar93) * 0.13333333333333333;
      }
      dVar12 = (dVar60 + dVar13) * 1.9236610509315362;
      if ((pdVar2 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar3 = (long)(p->dim).vrho * sVar4;
        pdVar2[lVar3 + 1] =
             ((dVar30 * (((dVar53 * dVar12 +
                          dVar70 * dVar12 * dVar49 + ((dVar9 - dVar40) - dVar26) + dVar10) - dVar31)
                        - dVar28) * 3.4602 +
              ((((dVar60 * 1.5874010519681996 * dVar27 * dVar11 * -0.09375 - dVar118) -
                dVar15 * local_4b8 * dVar16 * dVar11 * 0.09375) -
               dVar13 * 1.5874010519681996 * dVar25 * dVar11 * 0.09375) - dVar43) +
              dVar42 * dVar122 * dVar16 * dVar11 * -0.09375) - dVar14) * dVar39 + dVar54 +
             pdVar2[lVar3 + 1];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_LDA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, xc_lda_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    if(p->nspin == XC_POLARIZED){
      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le 0.0 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}